

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O0

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Print
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  const_iterator this_01;
  const_iterator out_00;
  reference this_02;
  ostream *in_RDX;
  char *in_RSI;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_RDI;
  const_iterator iter;
  _Self in_stack_ffffffffffffffc0;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> local_28 [2];
  ostream *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RDX,
                           "virtual void TPZDohrMatrix<double, TPZDohrSubstructCondense<double>>::Print(const char *, std::ostream &, const MatrixOutputFormat) const [TVar = double, TSubStruct = TPZDohrSubstructCondense<double>]"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_18,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_18,"Number of coarse equations ");
  this_00 = (void *)std::ostream::operator<<
                              (poVar2,*(int *)&in_RDI[2].
                                               super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                                               ._M_impl._M_node.super__List_node_base._M_prev);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::
  _List_const_iterator(local_28);
  this_01 = std::__cxx11::
            list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
            ::begin(in_RDI);
  local_28[0]._M_node = this_01._M_node;
  while( true ) {
    out_00 = std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
             ::end(in_RDI);
    bVar1 = std::operator!=(local_28,(_Self *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    this_02 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::
              operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> *)
                        in_stack_ffffffffffffffc0._M_node);
    TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(this_02);
    TPZDohrSubstructCondense<double>::Print
              ((TPZDohrSubstructCondense<double> *)this_01._M_node,(ostream *)out_00._M_node);
    in_stack_ffffffffffffffc0 =
         std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator++
                   (local_28,0);
  }
  return;
}

Assistant:

void Print(const char *name, std::ostream& out,const MatrixOutputFormat form = EFormatted) const override
	{
		out << __PRETTY_FUNCTION__ << std::endl;
		out << name << std::endl;
		out << "Number of coarse equations " << fNumCoarse << std::endl;
		typename SubsList::const_iterator iter;
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++) {
			(*iter)->Print(out);
		}
	}